

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  ostream *poVar1;
  int value;
  string local_40;
  CharFormat local_1c;
  ostream *poStack_18;
  CharFormat format;
  ostream *os_local;
  wchar_t c_local;
  
  poStack_18 = os;
  os_local._4_4_ = c;
  std::operator<<(os,"L\'");
  local_1c = PrintAsCharLiteralTo<wchar_t,wchar_t>(os_local._4_4_,poStack_18);
  std::operator<<(poStack_18,"\'");
  if (os_local._4_4_ != L'\0') {
    poVar1 = std::operator<<(poStack_18," (");
    std::ostream::operator<<(poVar1,os_local._4_4_);
    if ((local_1c != kHexEscape) && ((os_local._4_4_ < L'\x01' || (L'\t' < os_local._4_4_)))) {
      poVar1 = std::operator<<(poStack_18,", 0x");
      String::FormatHexInt_abi_cxx11_(&local_40,(String *)(ulong)(uint)os_local._4_4_,value);
      std::operator<<(poVar1,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::operator<<(poStack_18,")");
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexidecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}